

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::
Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
::do_call(Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  bool bVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  Boxed_Value BVar3;
  eval_error *o_1;
  eval_error *o;
  Boxed_Value *bv;
  Type_Conversions_State *in_stack_000000c0;
  Boxed_Value *in_stack_000000c8;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (in_RDX,0);
  bVar1 = Boxed_Value::is_const((Boxed_Value *)0x3c3e0c);
  if (bVar1) {
    boxed_cast<chaiscript::exception::eval_error_const*>(in_stack_000000c8,in_stack_000000c0);
    BVar3 = dispatch::detail::
            Handle_Return<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::handle((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    boxed_cast<chaiscript::exception::eval_error*>(in_stack_000000c8,in_stack_000000c0);
    BVar3 = dispatch::detail::
            Handle_Return<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::handle((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          const Boxed_Value &bv = params[0];
          if (bv.is_const())
          {
            const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
            return detail::Handle_Return<const typename std::add_lvalue_reference<T>::type>::handle(o->*m_attr);
          } else {
            Class *o = boxed_cast<Class *>(bv, &t_conversions);
            return detail::Handle_Return<typename std::add_lvalue_reference<T>::type>::handle(o->*m_attr);
          }
        }